

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::BinaryStandardOperatorWrapper,duckdb::SubtractOperatorOverflowCheck,bool>
               (uhugeint_t *ldata,uhugeint_t *rdata,uhugeint_t *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  idx_t row_idx;
  uint64_t *puVar5;
  idx_t row_idx_00;
  idx_t row_idx_01;
  uhugeint_t left;
  uhugeint_t uVar6;
  uhugeint_t right;
  uhugeint_t right_00;
  
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    puVar5 = &result_data->upper;
    for (uVar4 = 0; count != uVar4; uVar4 = uVar4 + 1) {
      uVar2 = uVar4;
      if (lsel->sel_vector != (sel_t *)0x0) {
        uVar2 = (ulong)lsel->sel_vector[uVar4];
      }
      uVar3 = uVar4;
      if (rsel->sel_vector != (sel_t *)0x0) {
        uVar3 = (ulong)rsel->sel_vector[uVar4];
      }
      left.upper = ldata[uVar2].upper;
      left.lower = ldata[uVar2].lower;
      right.upper = rdata[uVar3].upper;
      right.lower = rdata[uVar3].lower;
      uVar6 = SubtractOperatorOverflowCheck::
              Operation<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>(left,right);
      ((uhugeint_t *)(puVar5 + -1))->lower = uVar6.lower;
      *puVar5 = uVar6.upper;
      puVar5 = puVar5 + 2;
    }
  }
  else {
    puVar5 = &result_data->upper;
    for (row_idx_00 = 0; count != row_idx_00; row_idx_00 = row_idx_00 + 1) {
      row_idx_01 = row_idx_00;
      if (lsel->sel_vector != (sel_t *)0x0) {
        row_idx_01 = (idx_t)lsel->sel_vector[row_idx_00];
      }
      row_idx = row_idx_00;
      if (rsel->sel_vector != (sel_t *)0x0) {
        row_idx = (idx_t)rsel->sel_vector[row_idx_00];
      }
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&lvalidity->super_TemplatedValidityMask<unsigned_long>,row_idx_01);
      if (bVar1) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&rvalidity->super_TemplatedValidityMask<unsigned_long>,row_idx);
        if (!bVar1) goto LAB_018086c7;
        uVar6.upper = ldata[row_idx_01].upper;
        uVar6.lower = ldata[row_idx_01].lower;
        right_00.upper = rdata[row_idx].upper;
        right_00.lower = rdata[row_idx].lower;
        uVar6 = SubtractOperatorOverflowCheck::
                Operation<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>(uVar6,right_00);
        ((uhugeint_t *)(puVar5 + -1))->lower = uVar6.lower;
        *puVar5 = uVar6.upper;
      }
      else {
LAB_018086c7:
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&result_validity->super_TemplatedValidityMask<unsigned_long>,row_idx_00);
      }
      puVar5 = puVar5 + 2;
    }
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}